

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O3

void cPrint_Dense_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  puVar2 = (uint *)A->Store;
  uVar1 = *puVar2;
  iVar6 = 0;
  printf("\nDense matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  lVar3 = *(long *)(puVar2 + 2);
  printf("nrow %d, ncol %d, lda %d\n",(ulong)(uint)A->nrow,(ulong)(uint)A->ncol,(ulong)uVar1);
  printf("\nnzval: ");
  if (0 < A->ncol) {
    lVar5 = 0;
    do {
      if (0 < A->nrow) {
        lVar4 = 0;
        do {
          printf("%f  ",(double)*(float *)(lVar3 + (long)iVar6 * 4 + lVar4 * 4));
          lVar4 = lVar4 + 1;
        } while (SBORROW8(lVar4,(long)A->nrow * 2) != lVar4 + (long)A->nrow * -2 < 0);
      }
      putchar(10);
      lVar5 = lVar5 + 1;
      iVar6 = iVar6 + uVar1 * 2;
    } while (lVar5 < A->ncol);
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
cPrint_Dense_Matrix(char *what, SuperMatrix *A)
{
    DNformat     *Astore = (DNformat *) A->Store;
    register int i, j, lda = Astore->lda;
    float       *dp;
    
    printf("\nDense matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    dp = (float *) Astore->nzval;
    printf("nrow %d, ncol %d, lda %d\n", (int)A->nrow, (int)A->ncol, lda);
    printf("\nnzval: ");
    for (j = 0; j < A->ncol; ++j) {
        for (i = 0; i < 2*A->nrow; ++i) printf("%f  ", dp[i + j*2*lda]);
        printf("\n");
    }
    printf("\n");
    fflush(stdout);
}